

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_with_opts.c
# Opt level: O2

void parse_with_opts_should_handle_empty_strings(void)

{
  long lVar1;
  cJSON *pcVar2;
  long in_FS_OFFSET;
  char *error_pointer;
  char empty_string [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  empty_string[0] = '\0';
  error_pointer = (char *)0x0;
  pcVar2 = cJSON_ParseWithOpts(empty_string,(char **)0x0,0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x2c);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)empty_string,global_error_0 + global_error_1,(char *)0x0,0x2d,
             UNITY_DISPLAY_STYLE_HEX64);
  pcVar2 = cJSON_ParseWithOpts(empty_string,&error_pointer,0);
  if (pcVar2 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x2f);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)empty_string,(UNITY_INT)error_pointer,(char *)0x0,0x30,
             UNITY_DISPLAY_STYLE_HEX64);
  UnityAssertEqualNumber
            ((UNITY_INT)empty_string,global_error_0 + global_error_1,(char *)0x0,0x31,
             UNITY_DISPLAY_STYLE_HEX64);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_with_opts_should_handle_empty_strings(void)
{
    const char empty_string[] = "";
    const char *error_pointer = NULL;

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(empty_string, NULL, false));
    TEST_ASSERT_EQUAL_PTR(empty_string, cJSON_GetErrorPtr());

    TEST_ASSERT_NULL(cJSON_ParseWithOpts(empty_string, &error_pointer, false));
    TEST_ASSERT_EQUAL_PTR(empty_string, error_pointer);
    TEST_ASSERT_EQUAL_PTR(empty_string, cJSON_GetErrorPtr());
}